

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* bMatrix(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,double theta)

{
  void *pvVar1;
  long lVar2;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_02;
  allocator_type local_cc;
  allocator_type local_cb;
  allocator_type local_ca;
  allocator_type local_c9;
  double local_c8;
  vector<double,_std::allocator<double>_> local_c0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  double local_78 [4];
  double local_58;
  double local_50;
  undefined8 local_48;
  double local_40;
  double local_38;
  undefined8 local_30;
  
  local_c8 = theta;
  local_40 = cos(theta);
  local_38 = sin(local_c8);
  local_38 = -local_38;
  local_30 = 0;
  __l._M_len = 3;
  __l._M_array = &local_40;
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,__l,&local_c9);
  local_58 = sin(local_c8);
  local_50 = cos(local_c8);
  local_48 = 0;
  __l_00._M_len = 3;
  __l_00._M_array = &local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_a8,__l_00,&local_ca);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 1.0;
  __l_01._M_len = 3;
  __l_01._M_array = local_78;
  std::vector<double,_std::allocator<double>_>::vector(&local_90,__l_01,&local_cb);
  __l_02._M_len = 3;
  __l_02._M_array = &local_c0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__l_02,&local_cc);
  lVar2 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::vector<double> > bMatrix(double theta) {
    return {{std::cos(theta), -std::sin(theta), 0},
            {std::sin(theta), std::cos(theta), 0},
            {0, 0, 1}
    };
}